

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.h
# Opt level: O0

void enc_setup_mi(CommonModeInfoParams *mi_params)

{
  int iVar1;
  int iVar2;
  long in_RDI;
  int mi_grid_size;
  
  iVar2 = *(int *)(in_RDI + 0x3c);
  iVar1 = calc_mi_size(*(int *)(in_RDI + 0xc));
  iVar2 = iVar2 * iVar1;
  memset(*(void **)(in_RDI + 0x18),0,(long)*(int *)(in_RDI + 0x20) * 0xb0);
  memset(*(void **)(in_RDI + 0x30),0,(long)iVar2 << 3);
  memset(*(void **)(in_RDI + 0x40),0,(long)iVar2);
  return;
}

Assistant:

static inline void enc_setup_mi(CommonModeInfoParams *mi_params) {
  const int mi_grid_size =
      mi_params->mi_stride * calc_mi_size(mi_params->mi_rows);
  memset(mi_params->mi_alloc, 0,
         mi_params->mi_alloc_size * sizeof(*mi_params->mi_alloc));
  memset(mi_params->mi_grid_base, 0,
         mi_grid_size * sizeof(*mi_params->mi_grid_base));
  memset(mi_params->tx_type_map, 0,
         mi_grid_size * sizeof(*mi_params->tx_type_map));
}